

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

bool tinyxml2::XMLUtil::ToUnsigned64(char *str,uint64_t *value)

{
  int iVar1;
  byte bVar2;
  byte *pbVar3;
  char *pcVar4;
  unsigned_long_long v;
  uint64_t local_30;
  
  local_30 = 0;
  bVar2 = *str;
  pcVar4 = "%llu";
  if (-1 < (char)bVar2) {
    pbVar3 = (byte *)(str + 1);
    do {
      iVar1 = isspace((uint)bVar2);
      if (iVar1 == 0) {
        if ((bVar2 == 0x30) && (pcVar4 = "%llu", (*pbVar3 & 0xdf) == 0x58)) {
          pcVar4 = "%llx";
        }
        break;
      }
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (-1 < (char)bVar2);
  }
  iVar1 = __isoc99_sscanf(str,pcVar4,&local_30);
  if (iVar1 == 1) {
    *value = local_30;
  }
  return iVar1 == 1;
}

Assistant:

bool XMLUtil::ToUnsigned64(const char* str, uint64_t* value) {
    unsigned long long v = 0;	// horrible syntax trick to make the compiler happy about %llu
    if(TIXML_SSCANF(str, IsPrefixHex(str) ? "%llx" : "%llu", &v) == 1) {
        *value = (uint64_t)v;
        return true;
    }
    return false;
}